

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O1

void __thiscall sptk::reaper::FFT::ifft(FFT *this,float *x,float *y)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  float *pfVar10;
  uint uVar11;
  int iVar12;
  float *pfVar13;
  int iVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  int local_68;
  
  iVar12 = this->power2;
  uVar11 = this->fftSize;
  uVar6 = (ulong)uVar11;
  if (0 < iVar12) {
    local_68 = this->kbase;
    pfVar3 = this->fsine;
    pfVar4 = this->fcosine;
    iVar9 = 0;
    uVar8 = uVar6;
    do {
      iVar14 = (int)uVar8;
      uVar5 = (int)(uVar8 >> 0x1f) + iVar14 >> 1;
      if (1 < iVar14) {
        uVar21 = (ulong)uVar5;
        pfVar15 = y + uVar21;
        pfVar10 = x + uVar21;
        lVar7 = 0;
        uVar17 = 0;
        pfVar13 = y;
        pfVar16 = x;
        do {
          if (-1 < (int)(uVar11 - iVar14)) {
            fVar1 = pfVar4[lVar7];
            fVar2 = pfVar3[lVar7];
            uVar20 = uVar17 & 0xffffffff;
            lVar18 = 0;
            do {
              fVar23 = *(float *)((long)pfVar13 + lVar18) - *(float *)((long)pfVar15 + lVar18);
              fVar22 = *(float *)((long)pfVar16 + lVar18) - *(float *)((long)pfVar10 + lVar18);
              *(float *)((long)pfVar16 + lVar18) =
                   *(float *)((long)pfVar16 + lVar18) + *(float *)((long)pfVar10 + lVar18);
              *(float *)((long)pfVar13 + lVar18) =
                   *(float *)((long)pfVar15 + lVar18) + *(float *)((long)pfVar13 + lVar18);
              *(float *)((long)pfVar10 + lVar18) = fVar1 * fVar22 + fVar23 * -fVar2;
              *(float *)((long)pfVar15 + lVar18) = fVar22 * fVar2 + fVar1 * fVar23;
              lVar18 = lVar18 + uVar8 * 4;
              uVar19 = (int)uVar20 + iVar14;
              uVar20 = (ulong)uVar19;
            } while ((int)uVar19 <= (int)((uVar11 - iVar14) + (int)uVar17));
          }
          uVar17 = uVar17 + 1;
          lVar7 = lVar7 + local_68;
          pfVar15 = pfVar15 + 1;
          pfVar10 = pfVar10 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar16 = pfVar16 + 1;
        } while (uVar17 != uVar21);
      }
      iVar9 = iVar9 + 1;
      local_68 = local_68 * 2;
      uVar8 = (ulong)uVar5;
    } while (iVar9 != iVar12);
  }
  if (1 < (int)uVar11) {
    iVar12 = 1;
    uVar8 = 1;
    do {
      lVar7 = (long)iVar12;
      uVar17 = uVar6;
      if (lVar7 < (long)uVar8) {
        fVar1 = x[lVar7 + -1];
        fVar2 = y[lVar7 + -1];
        x[lVar7 + -1] = x[uVar8 - 1];
        y[lVar7 + -1] = y[uVar8 - 1];
        x[uVar8 - 1] = fVar1;
        y[uVar8 - 1] = fVar2;
      }
      do {
        iVar9 = iVar12;
        uVar11 = (int)uVar17 + (int)(uVar17 >> 0x1f) >> 1;
        uVar17 = (ulong)uVar11;
        iVar12 = iVar9 - uVar11;
      } while (iVar9 - uVar11 != 0 && (int)uVar11 <= iVar9);
      iVar12 = uVar11 + iVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

void FFT::ifft(float *x, float *y) {
  float c, s,  t1, t2;
  int j1, j2, li, lix, i;
  int lmx, lo, lixnp, lm, j, nv2, k = kbase, im, jm, l = power2;

  for (lmx = fftSize, lo = 0; lo < l; lo++, k *= 2) {
    lix = lmx;
    lmx /= 2;
    lixnp = fftSize - lix;
    for (i = 0, lm = 0; lm < lmx; lm++, i += k) {
      c = fcosine[i];
      s = -fsine[i];
      for (li = lixnp + lm, j1 = lm, j2 = lm + lmx; j1 <= li;
            j1 += lix, j2 += lix) {
        t1 = x[j1] - x[j2];
        t2 = y[j1] - y[j2];
        x[j1] += x[j2];
        y[j1] += y[j2];
        x[j2] = (c * t1) + (s * t2);
        y[j2] = (c * t2) - (s * t1);
      }
    }
  }

  /* Now perform the bit reversal. */
  j = 1;
  nv2 = fftSize / 2;
  for (i = 1; i < fftSize; i++) {
    if (j < i) {
      jm = j-1;
      im = i-1;
      t1 = x[jm];
      t2 = y[jm];
      x[jm] = x[im];
      y[jm] = y[im];
      x[im] = t1;
      y[im] = t2;
    }
    k = nv2;
    while (j > k) {
      j -= k;
      k /= 2;
    }
    j += k;
  }
}